

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffsparser.cpp
# Opt level: O2

USTATUS __thiscall
FfsParser::parseSections
          (FfsParser *this,UByteArray *sections,UModelIndex *index,bool insertIntoTree)

{
  uint uVar1;
  TreeModel *this_00;
  uint uVar2;
  bool bVar3;
  UINT8 UVar4;
  UINT32 len;
  int iVar5;
  USTATUS UVar6;
  int i;
  int __c;
  FfsParser *this_01;
  UINT32 sectionOffset;
  UModelIndex sectionIndex;
  UByteArray data;
  CBString info;
  UModelIndex parentVolumeIndex;
  undefined1 local_98 [16];
  undefined1 local_88 [64];
  UModelIndex dataIndex;
  
  bVar3 = UModelIndex::isValid(index);
  if (bVar3) {
    uVar1 = (uint)(sections->d)._M_string_length;
    TreeModel::header(&data,this->model,index);
    uVar2 = (uint)data.d._M_string_length;
    std::__cxx11::string::~string((string *)&data);
    this_01 = (FfsParser *)&parentVolumeIndex;
    TreeModel::findParentOfType((UModelIndex *)this_01,this->model,index,'A');
    UVar4 = '\x02';
    if (((-1 < parentVolumeIndex.r) && (-1 < parentVolumeIndex.c)) &&
       (parentVolumeIndex.m != (TreeModel *)0x0)) {
      this_01 = (FfsParser *)this->model;
      bVar3 = TreeModel::hasEmptyParsingData((TreeModel *)this_01,&parentVolumeIndex);
      if (!bVar3) {
        this_01 = (FfsParser *)&data;
        TreeModel::parsingData((UByteArray *)this_01,this->model,&parentVolumeIndex);
        UVar4 = data.d._M_dataplus._M_p[0x19];
        std::__cxx11::string::~string((string *)this_01);
      }
    }
    for (sectionOffset = 0; sectionOffset < uVar1;
        sectionOffset = sectionOffset + len + 3 & 0xfffffffc) {
      len = getSectionSize(this_01,sections,sectionOffset,UVar4);
      if ((len < 4) || (uVar1 - sectionOffset < len)) {
        if (!insertIntoTree) {
          return 0x14;
        }
        UByteArray::mid(&data,sections,sectionOffset,-1);
        usprintf(&info,"Full size: %Xh (%u)",(ulong)(uint)data.d._M_string_length);
        this_00 = this->model;
        Bstrlib::CBString::CBString((CBString *)(local_88 + 0x10),"Non-UEFI data");
        Bstrlib::CBString::CBString((CBString *)(local_88 + 0x28));
        sectionIndex._0_8_ = &sectionIndex.m;
        sectionIndex.i = 0;
        sectionIndex.m = (TreeModel *)((ulong)sectionIndex.m & 0xffffffffffffff00);
        local_98._0_8_ = local_88;
        local_98._8_8_ = (FitParser *)0x0;
        local_88[0] = '\0';
        TreeModel::addItem(&dataIndex,this_00,sectionOffset + uVar2,'@','z',
                           (CBString *)(local_88 + 0x10),(CBString *)(local_88 + 0x28),&info,
                           (UByteArray *)&sectionIndex,&data,(UByteArray *)local_98,Fixed,index,'\0'
                          );
        std::__cxx11::string::~string((string *)local_98);
        std::__cxx11::string::~string((string *)&sectionIndex);
        Bstrlib::CBString::~CBString((CBString *)(local_88 + 0x28));
        Bstrlib::CBString::~CBString((CBString *)(local_88 + 0x10));
        usprintf((CBString *)&sectionIndex,"%s: non-UEFI data found in sections area",
                 "parseSections");
        msg(this,(CBString *)&sectionIndex,&dataIndex);
        Bstrlib::CBString::~CBString((CBString *)&sectionIndex);
        Bstrlib::CBString::~CBString(&info);
        std::__cxx11::string::~string((string *)&data);
        break;
      }
      sectionIndex.r = -1;
      sectionIndex.c = -1;
      sectionIndex.i = 0;
      sectionIndex.m = (TreeModel *)0x0;
      UByteArray::mid(&data,sections,sectionOffset,len);
      UVar6 = parseSectionHeader(this,&data,sectionOffset + uVar2,index,&sectionIndex,insertIntoTree
                                );
      this_01 = (FfsParser *)&data;
      std::__cxx11::string::~string((string *)&data);
      if (UVar6 != 0) {
        if (!insertIntoTree) {
          return 0x14;
        }
        this_01 = (FfsParser *)local_98;
        usprintf((CBString *)this_01,"%s: section header parsing failed with error ","parseSections"
                );
        errorCodeToUString(&info,UVar6);
        Bstrlib::CBString::operator+((CBString *)&data,(CBString *)this_01,&info);
        msg(this,(CBString *)&data,index);
        Bstrlib::CBString::~CBString((CBString *)&data);
        Bstrlib::CBString::~CBString(&info);
        Bstrlib::CBString::~CBString((CBString *)this_01);
      }
    }
    UVar6 = 0;
    for (__c = 0; iVar5 = TreeModel::rowCount(this->model,index), __c < iVar5; __c = __c + 1) {
      TreeModel::index((TreeModel *)&data,(char *)index->m,__c);
      UVar4 = TreeModel::type(this->model,(UModelIndex *)&data);
      if (UVar4 != '@') {
        if (UVar4 != 'C') {
          return 9;
        }
        parseSectionBody(this,(UModelIndex *)&data);
      }
    }
  }
  else {
    UVar6 = 1;
  }
  return UVar6;
}

Assistant:

USTATUS FfsParser::parseSections(const UByteArray & sections, const UModelIndex & index, const bool insertIntoTree)
{
    // Sanity check
    if (!index.isValid())
        return U_INVALID_PARAMETER;
    
    // Search for and parse all sections
    UINT32 bodySize = (UINT32)sections.size();
    UINT32 headerSize = (UINT32)model->header(index).size();
    UINT32 sectionOffset = 0;
    USTATUS result = U_SUCCESS;
    
    // Obtain required information from parent volume
    UINT8 ffsVersion = 2;
    UModelIndex parentVolumeIndex = model->findParentOfType(index, Types::Volume);
    if (parentVolumeIndex.isValid() && model->hasEmptyParsingData(parentVolumeIndex) == false) {
        UByteArray data = model->parsingData(parentVolumeIndex);
        const VOLUME_PARSING_DATA* pdata = (const VOLUME_PARSING_DATA*)data.constData();
        ffsVersion = pdata->ffsVersion;
    }
    
    // Iterate over sections
    UINT32 sectionSize = 0;
    while (sectionOffset < bodySize) {
        // Get section size
        sectionSize = getSectionSize(sections, sectionOffset, ffsVersion);
        
        // Check section size to be sane
        if (sectionSize < sizeof(EFI_COMMON_SECTION_HEADER)
            || sectionSize > (bodySize - sectionOffset)) {
            // Final parsing
            if (insertIntoTree) {
                // Add padding to fill the rest of sections
                UByteArray padding = sections.mid(sectionOffset);
                
                // Get info
                UString info = usprintf("Full size: %Xh (%u)", (UINT32)padding.size(), (UINT32)padding.size());
                
                // Add tree item
                UModelIndex dataIndex = model->addItem(headerSize + sectionOffset, Types::Padding, Subtypes::DataPadding, UString("Non-UEFI data"), UString(), info, UByteArray(), padding, UByteArray(), Fixed, index);
                
                // Show message
                msg(usprintf("%s: non-UEFI data found in sections area", __FUNCTION__), dataIndex);
                
                // Exit from parsing loop
                break;
            }
            // Preliminary parsing
            else {
                return U_INVALID_SECTION;
            }
        }
        
        // Parse section header
        UModelIndex sectionIndex;
        result = parseSectionHeader(sections.mid(sectionOffset, sectionSize), headerSize + sectionOffset, index, sectionIndex, insertIntoTree);
        if (result) {
            if (insertIntoTree)
                msg(usprintf("%s: section header parsing failed with error ", __FUNCTION__) + errorCodeToUString(result), index);
            else
                return U_INVALID_SECTION;
        }
        
        // Move to next section
        sectionOffset += sectionSize;
        // TODO: verify that alignment bytes are actually zero as per PI spec
        sectionOffset = ALIGN4(sectionOffset);
    }
    
#if 0 // Do not enable this in production for now, as it needs further investigation.
    // The PI spec requires sections to be aligned by 4 byte boundary with bytes that are all exactly zeroes
    // Some images interpret "must be aligned by 4" as "every section needs to be padded for sectionSize to be divisible by 4".
    // Detecting this case can be done by checking for the very last section to have sectionSize not divisible by 4, while the total bodySize is.
    // However, such detection for a single file is unreliable because in 1/4 random cases the last section will be divisible by 4.
    // We also know that either PEI core or DXE core is entity that does file and section parsing,
    // so every single file in the volume should behave consistently.
    // This makes the probability of unsuccessful detection here to be 1/(4^numFilesInVolume),
    // which is low enough for real images out there.
    // It should also be noted that enabling this section alignment quirk for an image that doesn't require it
    // will not make the image unbootable, but will waste some space and possibly require to move some files around
    if (sectionOffset == bodySize) {
        // We are now at the very end of the file body, and sectionSize is the size of the last section
        if ((sectionSize % 4 != 0) // sectionSize of the very last section is not divisible by 4
            && (bodySize % 4 == 0)) { // yet bodySize is, meaning that there are indeed some padding bytes added after the last section
            msg(usprintf("%s: section alignment quirk found", __FUNCTION__), index);
        }
    }
#endif
    
    // Parse bodies, will be skipped if insertIntoTree is not required
    for (int i = 0; i < model->rowCount(index); i++) {
        UModelIndex current = index.model()->index(i, 0, index);
        
        switch (model->type(current)) {
            case Types::Section:
                parseSectionBody(current);
                break;
            case Types::Padding:
                // No parsing required
                break;
            default:
                return U_UNKNOWN_ITEM_TYPE;
        }
    }
    
    return U_SUCCESS;
}